

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>&&>>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>>>
           *this,iterator iter,piecewise_construct_t *args,
          tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
          *args_1,tuple<std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_&&>
                  *args_2)

{
  iterator i;
  bool bVar1;
  slot_type *slot;
  reference ts;
  const_iterator local_60;
  FindElement local_50;
  iterator local_48;
  tuple<std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_&&>
  *local_38;
  tuple<std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_&&>
  *args_local_2;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
  *args_local_1;
  piecewise_construct_t *args_local;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
  *this_local;
  iterator iter_local;
  
  iter_local.ctrl_ = (ctrl_t *)iter.field_1;
  this_local = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
                *)iter.ctrl_;
  local_38 = args_2;
  args_local_2 = (tuple<std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_&&>
                  *)args_1;
  args_local_1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
                  *)args;
  args_local = (piecewise_construct_t *)this;
  slot = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
         ::iterator::slot((iterator *)&this_local);
  construct<std::piecewise_construct_t_const&,std::tuple<std::__cxx11::string&&>,std::tuple<std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>&&>>
            (this,slot,(piecewise_construct_t *)args_local_1,
             (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&&>
              *)args_local_2,local_38);
  local_50.s = (raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
                *)this;
  ts = raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
       ::iterator::operator*((iterator *)&this_local);
  local_48 = (iterator)
             hash_policy_traits<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>,void>
             ::
             apply<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>,absl::lts_20240722::container_internal::StringHash,absl::lts_20240722::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>>>::FindElement,std::pair<std::__cxx11::string_const,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>&,absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::string,std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>>>>
                       (&local_50,ts);
  i.field_1.slot_ = (slot_type *)iter_local.ctrl_;
  i.ctrl_ = (ctrl_t *)this_local;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>,_absl::lts_20240722::container_internal::StringHash,_absl::lts_20240722::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum,_std::default_delete<google::protobuf::json_internal::ResolverPool::Enum>_>_>_>_>
  ::const_iterator::const_iterator(&local_60,i);
  bVar1 = container_internal::operator==((const_iterator *)&local_48,&local_60);
  if (!bVar1) {
    __assert_fail("PolicyTraits::apply(FindElement{*this}, *iter) == iter && \"constructed value does not match the lookup key\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xf3f,
                  "void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>>>::emplace_at(iterator, Args &&...) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum>>>, Args = <const std::piecewise_construct_t &, std::tuple<std::basic_string<char> &&>, std::tuple<std::unique_ptr<google::protobuf::json_internal::ResolverPool::Enum> &&>>]"
                 );
  }
  return;
}

Assistant:

void emplace_at(iterator iter, Args&&... args) {
    construct(iter.slot(), std::forward<Args>(args)...);

    assert(PolicyTraits::apply(FindElement{*this}, *iter) == iter &&
           "constructed value does not match the lookup key");
  }